

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

bool __thiscall
google::
dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::resize_delta(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
               *this,size_type delta)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  length_error *this_00;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  tmp;
  
  if ((this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.consider_shrink_
      == true) {
    bVar1 = maybe_shrink(this);
  }
  else {
    bVar1 = false;
  }
  bVar2 = this->num_elements;
  if ((uint)bVar2 < (delta ^ 0xff)) {
    if ((this->num_buckets < 4) ||
       ((uint)(this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.
              enlarge_threshold_ < (uint)bVar2 + (uint)delta)) {
      bVar2 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::min_buckets
                        ((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)this,bVar2 + delta,
                         '\0');
      if (this->num_buckets < bVar2) {
        bVar2 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::
                min_buckets((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)this,
                            (this->num_elements + delta) - this->num_deleted,this->num_buckets);
        bVar3 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::
                min_buckets((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)this,
                            (delta + this->num_elements) - (this->num_deleted >> 2),'\0');
        if (((bVar2 < 0x7f) && (bVar2 < bVar3)) &&
           ((int)((int)((float)(byte)(bVar2 * '\x02') *
                       (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.
                       shrink_factor_) & 0xffU) <=
            (int)(((uint)this->num_elements + (uint)delta) - (uint)this->num_deleted))) {
          bVar2 = bVar2 * '\x02';
        }
        dense_hashtable(&tmp,this,bVar2);
        swap(this,&tmp);
        free(tmp.table);
        bVar1 = true;
      }
    }
    return bVar1;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"resize overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

bool resize_delta(size_type delta) {
    bool did_resize = false;
    if (settings.consider_shrink()) {  // see if lots of deletes happened
      if (maybe_shrink()) did_resize = true;
    }
    if (num_elements >= (std::numeric_limits<size_type>::max)() - delta) {
      throw std::length_error("resize overflow");
    }
    if (bucket_count() >= HT_MIN_BUCKETS &&
        (num_elements + delta) <= settings.enlarge_threshold())
      return did_resize;  // we're ok as we are

    // Sometimes, we need to resize just to get rid of all the
    // "deleted" buckets that are clogging up the hashtable.  So when
    // deciding whether to resize, count the deleted buckets (which
    // are currently taking up room).  But later, when we decide what
    // size to resize to, *don't* count deleted buckets, since they
    // get discarded during the resize.
    size_type needed_size = settings.min_buckets(num_elements + delta, 0);
    if (needed_size <= bucket_count())  // we have enough buckets
      return did_resize;

    size_type resize_to = settings.min_buckets(
        num_elements - num_deleted + delta, bucket_count());

    // When num_deleted is large, we may still grow but we do not want to
    // over expand.  So we reduce needed_size by a portion of num_deleted
    // (the exact portion does not matter).  This is especially helpful
    // when min_load_factor is zero (no shrink at all) to avoid doubling
    // the bucket count to infinity.  See also test ResizeWithoutShrink.
    needed_size = settings.min_buckets(num_elements - num_deleted / 4 + delta, 0);

    if (resize_to < needed_size &&  // may double resize_to
        resize_to < (std::numeric_limits<size_type>::max)() / 2) {
      // This situation means that we have enough deleted elements,
      // that once we purge them, we won't actually have needed to
      // grow.  But we may want to grow anyway: if we just purge one
      // element, say, we'll have to grow anyway next time we
      // insert.  Might as well grow now, since we're already going
      // through the trouble of copying (in order to purge the
      // deleted elements).
      const size_type target =
          static_cast<size_type>(settings.shrink_size(resize_to * 2));
      if (num_elements - num_deleted + delta >= target) {
        // Good, we won't be below the shrink threshhold even if we double.
        resize_to *= 2;
      }
    }
    dense_hashtable tmp(std::move(*this), resize_to);
    swap(tmp);  // now we are tmp
    return true;
  }